

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall
caffe::MemoryDataParameter::InternalSwap(MemoryDataParameter *this,MemoryDataParameter *other)

{
  uint32 uVar1;
  int iVar2;
  void *pvVar3;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar4;
  void *pvVar5;
  UnknownFieldSet *pUVar6;
  UnknownFieldSet *pUVar7;
  
  uVar1 = this->batch_size_;
  this->batch_size_ = other->batch_size_;
  other->batch_size_ = uVar1;
  uVar1 = this->channels_;
  this->channels_ = other->channels_;
  other->channels_ = uVar1;
  uVar1 = this->height_;
  this->height_ = other->height_;
  other->height_ = uVar1;
  uVar1 = this->width_;
  this->width_ = other->width_;
  other->width_ = uVar1;
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  pvVar5 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  pvVar3 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar5 & 1) == 0) {
    if (((ulong)pvVar3 & 1) == 0) goto LAB_0041324a;
LAB_00413232:
    pUVar7 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar3 & 1) != 0) goto LAB_00413232;
    pUVar7 = google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(other->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
    pvVar5 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
  }
  if (((ulong)pvVar5 & 1) == 0) {
    pUVar6 = google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
  }
  else {
    pUVar6 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
  }
  pvVar4 = pUVar6->fields_;
  pUVar6->fields_ = pUVar7->fields_;
  pUVar7->fields_ = pvVar4;
LAB_0041324a:
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void MemoryDataParameter::InternalSwap(MemoryDataParameter* other) {
  std::swap(batch_size_, other->batch_size_);
  std::swap(channels_, other->channels_);
  std::swap(height_, other->height_);
  std::swap(width_, other->width_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}